

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O2

QList<QList<QGraphicsItem_*>_> * __thiscall
QList<QList<QGraphicsItem_*>_>::fill
          (QList<QList<QGraphicsItem_*>_> *this,parameter_type t,qsizetype newSize)

{
  Data *pDVar1;
  Data *pDVar2;
  QList<QGraphicsItem_*> *b;
  long lVar3;
  undefined1 auVar4 [16];
  qsizetype qVar5;
  char *pcVar6;
  __off_t __length;
  long in_FS_OFFSET;
  pair<QTypedArrayData<QList<QGraphicsItem_*>_>_*,_QList<QGraphicsItem_*>_*> local_48;
  qsizetype local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (newSize == -1) {
    newSize = (this->d).size;
  }
  pDVar1 = (this->d).d;
  if (((pDVar1 == (Data *)0x0) ||
      (1 < (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) ||
     ((pDVar1->super_QArrayData).alloc < newSize)) {
    qVar5 = QArrayDataPointer<QList<QGraphicsItem_*>_>::detachCapacity(&this->d,newSize);
    local_48 = QTypedArrayData<QList<QGraphicsItem_*>_>::allocate(qVar5,KeepSize);
    local_38 = 0;
    QtPrivate::QGenericArrayOps<QList<QGraphicsItem_*>_>::copyAppend
              ((QGenericArrayOps<QList<QGraphicsItem_*>_> *)&local_48,newSize,t);
    auVar4._0_8_ = (this->d).d;
    auVar4._8_8_ = (this->d).ptr;
    (this->d).d = local_48.first;
    (this->d).ptr = local_48.second;
    qVar5 = (this->d).size;
    (this->d).size = local_38;
    local_48 = (pair<QTypedArrayData<QList<QGraphicsItem_*>_>_*,_QList<QGraphicsItem_*>_*>)auVar4;
    local_38 = qVar5;
    QArrayDataPointer<QList<QGraphicsItem_*>_>::~QArrayDataPointer
              ((QArrayDataPointer<QList<QGraphicsItem_*>_> *)&local_48);
  }
  else {
    pDVar2 = (t->d).d;
    local_48.first = (QTypedArrayData<QList<QGraphicsItem_*>_> *)(t->d).d;
    local_48.second = (QList<QGraphicsItem_*> *)(t->d).ptr;
    local_38 = (t->d).size;
    if (pDVar2 != (Data *)0x0) {
      LOCK();
      (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    b = (this->d).ptr;
    pcVar6 = (char *)(this->d).size;
    if (newSize <= (long)pcVar6) {
      pcVar6 = (char *)newSize;
    }
    QtPrivate::QGenericArrayOps<QList<QGraphicsItem_*>_>::assign
              ((QGenericArrayOps<QList<QGraphicsItem_*>_> *)this,b,b + (long)pcVar6,t);
    lVar3 = (this->d).size;
    if (newSize - lVar3 == 0 || newSize < lVar3) {
      if (newSize < lVar3) {
        QtPrivate::QGenericArrayOps<QList<QGraphicsItem_*>_>::truncate
                  ((QGenericArrayOps<QList<QGraphicsItem_*>_> *)this,(char *)newSize,__length);
      }
    }
    else {
      QtPrivate::QGenericArrayOps<QList<QGraphicsItem_*>_>::copyAppend
                ((QGenericArrayOps<QList<QGraphicsItem_*>_> *)this,newSize - lVar3,
                 (parameter_type)&local_48);
    }
    QArrayDataPointer<QGraphicsItem_*>::~QArrayDataPointer
              ((QArrayDataPointer<QGraphicsItem_*> *)&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

inline QList<T> &QList<T>::fill(parameter_type t, qsizetype newSize)
{
    if (newSize == -1)
        newSize = size();
    if (d->needsDetach() || newSize > capacity()) {
        // must allocate memory
        DataPointer detached(d->detachCapacity(newSize));
        detached->copyAppend(newSize, t);
        d.swap(detached);
    } else {
        // we're detached
        const T copy(t);
        d->assign(d.begin(), d.begin() + qMin(size(), newSize), t);
        if (newSize > size()) {
            d->copyAppend(newSize - size(), copy);
        } else if (newSize < size()) {
            d->truncate(newSize);
        }
    }
    return *this;
}